

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.h
# Opt level: O2

int __thiscall Value::copy(Value *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Type TVar1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  __shared_ptr<Value::Custom,_(__gnu_cxx::_Lock_policy)2> *__x;
  anon_union_48_10_37e00c34_for_mData *this_00;
  
  if (this->mType == Type_Invalid) {
    TVar1 = *(Type *)dst;
    this->mType = TVar1;
    this_00 = &this->mData;
    __x = (__shared_ptr<Value::Custom,_(__gnu_cxx::_Lock_policy)2> *)(dst + 8);
    iVar7 = TVar1 - Type_String;
    switch(iVar7) {
    case 0:
      iVar7 = std::__cxx11::string::string((string *)&this_00->boolean,(string *)__x);
      return iVar7;
    case 1:
      std::__shared_ptr<Value::Custom,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Value::Custom,_(__gnu_cxx::_Lock_policy)2> *)this_00,__x);
      return extraout_EAX_01;
    case 2:
      std::
      _Rb_tree<String,_std::pair<const_String,_Value>,_std::_Select1st<std::pair<const_String,_Value>_>,_std::less<String>,_std::allocator<std::pair<const_String,_Value>_>_>
      ::_Rb_tree((_Rb_tree<String,_std::pair<const_String,_Value>,_std::_Select1st<std::pair<const_String,_Value>_>,_std::less<String>,_std::allocator<std::pair<const_String,_Value>_>_>
                  *)this_00,
                 (_Rb_tree<String,_std::pair<const_String,_Value>,_std::_Select1st<std::pair<const_String,_Value>_>,_std::less<String>,_std::allocator<std::pair<const_String,_Value>_>_>
                  *)__x);
      return extraout_EAX;
    case 3:
      std::vector<Value,_std::allocator<Value>_>::vector
                ((vector<Value,_std::allocator<Value>_> *)this_00,
                 (vector<Value,_std::allocator<Value>_> *)__x);
      return extraout_EAX_00;
    default:
      peVar2 = __x->_M_ptr;
      uVar3 = *(undefined8 *)(dst + 0x10);
      uVar4 = *(undefined8 *)(dst + 0x18);
      uVar5 = *(undefined8 *)(dst + 0x20);
      uVar6 = *(undefined8 *)(dst + 0x30);
      *(undefined8 *)((long)&this->mData + 0x20) = *(undefined8 *)(dst + 0x28);
      *(undefined8 *)((long)&this->mData + 0x28) = uVar6;
      *(undefined8 *)((long)&this->mData + 0x10) = uVar4;
      *(undefined8 *)((long)&this->mData + 0x18) = uVar5;
      this_00->llong = (longlong)peVar2;
      *(undefined8 *)((long)&this->mData + 8) = uVar3;
      return iVar7;
    }
  }
  __assert_fail("isNull()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Value.cpp",
                0x1d,"void Value::copy(const Value &)");
}

Assistant:

inline bool isNull() const { return mType == Type_Invalid; }